

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.cpp
# Opt level: O3

Error uv11::read_start(Stream *stream,AllocCb *alloc_cb,ReadCb *read_cb)

{
  AllocCb *this;
  ReadCb *this_00;
  _Manager_type p_Var1;
  int s;
  Error EVar3;
  error_category *peVar4;
  error_code eVar2;
  
  this = &(stream->super_Handle).on_alloc;
  std::function<void_(uv11::Handle_&,_unsigned_long,_uv_buf_t_*)>::operator=(this,alloc_cb);
  this_00 = &stream->on_read;
  std::function<void_(uv11::Stream_&,_const_uv11::Buffer_&,_long,_std::error_code)>::operator=
            (this_00,read_cb);
  s = uv_read_start(stream->stream_ptr,read_start::anon_class_1_0_00000001::__invoke,
                    read_start::anon_class_1_0_00000001::__invoke);
  if (s != 0) {
    p_Var1 = (stream->super_Handle).on_alloc.super__Function_base._M_manager;
    if (p_Var1 != (_Manager_type)0x0) {
      (*p_Var1)((_Any_data *)this,(_Any_data *)this,__destroy_functor);
      (stream->super_Handle).on_alloc.super__Function_base._M_manager = (_Manager_type)0x0;
      (stream->super_Handle).on_alloc._M_invoker = (_Invoker_type)0x0;
    }
    p_Var1 = (stream->on_read).super__Function_base._M_manager;
    if (p_Var1 != (_Manager_type)0x0) {
      (*p_Var1)((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
      (stream->on_read).super__Function_base._M_manager = (_Manager_type)0x0;
      (stream->on_read)._M_invoker = (_Invoker_type)0x0;
    }
  }
  eVar2 = make_error(s);
  EVar3._M_value = eVar2._M_value;
  EVar3._4_4_ = eVar2._4_4_;
  register0x00000010 = eVar2._M_cat;
  return EVar3;
}

Assistant:

Error uv11::read_start(Stream& stream, AllocCb const& alloc_cb, ReadCb const& read_cb) {
    stream.on_alloc = alloc_cb;
    stream.on_read = read_cb;

    int s = ::uv_read_start(
        &stream.GetStream(),
        [](uv_handle_t* handle, ::size_t suggested_size, ::uv_buf_t* buf) {
            Handle* h = reinterpret_cast<Handle*>(handle->data);
            return h->on_alloc(*h, suggested_size, buf);
        },
        [](uv_stream_t* stream_ptr, ::ssize_t nread, ::uv_buf_t const* buf){
            Stream* strm = reinterpret_cast<Stream*>(stream_ptr->data);
            // FIXME: How do we handle errors - i.e. if nread < 0
            if (nread >= 0) {
                return strm->on_read(
                    *strm,
                    *buf,
                    nread,
                    make_error(0)
                );
            } else {
                return strm->on_read(
                    *strm,
                    *buf,
                    0,
                    make_error(static_cast<int>(nread))
                );
            }
        }
    );

    if (s) {
        stream.on_alloc = nullptr;
        stream.on_read = nullptr;
    }

    return make_error(s);
}